

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

ValueType __thiscall ValueType::ToDefinitePrimitiveSubset(ValueType *this)

{
  code *pcVar1;
  bool bVar2;
  ValueType e1;
  Bits BVar3;
  Bits BVar4;
  Bits BVar5;
  undefined4 *puVar6;
  Bits local_30;
  ValueType *this_local;
  
  bVar2 = HasBeenPrimitive(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x3dd,"(HasBeenPrimitive())","HasBeenPrimitive()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = HasBeenObject(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x3de,"(HasBeenObject())","HasBeenObject()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = IsLikelyObject(this);
  if ((bVar2) && (bVar2 = IsLikelyPrimitive(this), bVar2)) {
    BVar5 = (this->field_0).bits;
    BVar3 = operator|(Undefined,Null);
    BVar5 = ::operator&(BVar5,BVar3);
    e1 = ToDefiniteObject(this);
    BVar5 = operator|(BVar5,(Bits)e1.field_0);
    this_local._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)Verify(BVar5);
  }
  else {
    BVar5 = (this->field_0).bits;
    bVar2 = OneOn(this,Object);
    if (bVar2) {
      BVar3 = BitPattern(5);
      BVar4 = operator|(Likely,Object);
      local_30 = ::operator-(BVar3,BVar4);
    }
    else {
      BVar3 = BitPattern(0xf);
      BVar4 = operator|(Likely,Object);
      BVar4 = operator|(BVar4,PrimitiveOrObject);
      local_30 = ::operator-(BVar3,BVar4);
    }
    BVar5 = ::operator&(BVar5,local_30);
    this_local._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)Verify(BVar5);
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)this_local._6_2_;
}

Assistant:

ValueType ValueType::ToDefinitePrimitiveSubset() const
{
    // This function does not do a safe conversion of an arbitrary type to a definitely-primitive type. It only obtains the
    // primitive subset of bits from the type.

    // When Undefined (or Null) merge with Object, the resulting value type is still likely Object (IsLikelyObject() returns
    // true). ToDefinite() on the merged type would return a type that is definitely Undefined or Object. Usually, that type is
    // not interesting and a test for one or more of the primitive types may have been done. ToDefinitePrimitive() removes the
    // object-specific bits.

    Assert(HasBeenPrimitive());
    Assert(HasBeenObject());

    // If we have an object format of a type (object bit = 1) that represents a primitive (e.g. SIMD128),
    // we want to keep the object bit and type along with other merged primitives (Undefined and/or Null).
    if (IsLikelyObject() && IsLikelyPrimitive())
        return Verify(bits & (Bits::Undefined | Bits::Null) | ToDefiniteObject().bits);

    return
        Verify(
        bits &
        (
            OneOn(Bits::Object)
                ?
                        BitPattern(VALUE_TYPE_COMMON_BIT_COUNT) - (Bits::Likely | Bits::Object)
                    :
                        BitPattern(VALUE_TYPE_COMMON_BIT_COUNT + VALUE_TYPE_NONOBJECT_BIT_COUNT) -
                        (Bits::Likely | Bits::Object | Bits::PrimitiveOrObject)
            ));
}